

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourceGoniometric::~IfcLightSourceGoniometric
          (IfcLightSourceGoniometric *this)

{
  undefined1 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 *puVar2;
  size_type *psVar3;
  
  *(undefined8 *)&this[-1].super_IfcLightSource.field_0x80 = 0x89d938;
  *(undefined8 *)&(this->super_IfcLightSource).AmbientIntensity.have = 0x89d9d8;
  *(undefined8 *)&this[-1].super_IfcLightSource.field_0x90 = 0x89d960;
  *(undefined8 *)&this[-1].ColourAppearance.have = 0x89d988;
  (this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x89d9b0;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (this->super_IfcLightSource).AmbientIntensity.ptr;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcLightSource).field_0x38;
  puVar1 = &(this->super_IfcLightSource).field_0x48;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  *(undefined8 *)&this[-1].super_IfcLightSource.field_0x80 = 0x89dab0;
  *(undefined8 *)&(this->super_IfcLightSource).AmbientIntensity.have = 0x89db28;
  *(undefined8 *)&this[-1].super_IfcLightSource.field_0x90 = 0x89dad8;
  *(undefined8 *)&this[-1].ColourAppearance.have = 0x89db00;
  psVar3 = &this[-1].LightEmissionSource._M_string_length;
  if ((size_type *)this[-1].LuminousFlux != psVar3) {
    operator_delete((undefined1 *)this[-1].LuminousFlux,*psVar3 + 1);
    return;
  }
  return;
}

Assistant:

IfcLightSourceGoniometric() : Object("IfcLightSourceGoniometric") {}